

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_validfilename(char *fname)

{
  char *pcVar1;
  int iVar2;
  
  if ((fname == (char *)0x0) || (*fname == '\0')) {
    iVar2 = 0;
    if (1 < g_opts_0) {
      nifti_validfilename_cold_1();
    }
  }
  else {
    pcVar1 = nifti_find_file_extension(fname);
    iVar2 = 1;
    if ((pcVar1 == fname) && (iVar2 = 0, 0 < g_opts_0)) {
      iVar2 = 0;
      fprintf(_stderr,"-- no prefix for filename \'%s\'\n",fname);
    }
  }
  return iVar2;
}

Assistant:

int nifti_validfilename(const char* fname)
{
   const char * ext;

   /* check input file(s) for sanity */
   if( fname == NULL || *fname == '\0' ){
      if ( g_opts.debug > 1 )
         fprintf(stderr,"-- empty filename in nifti_validfilename()\n");
      return 0;
   }

   ext = nifti_find_file_extension(fname);

   if ( ext && ext == fname ) {   /* then no filename prefix */
      if ( g_opts.debug > 0 )
         fprintf(stderr,"-- no prefix for filename '%s'\n", fname);
      return 0;
   }

   return 1;
}